

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::FenceVkImpl> *this,FenceVkImpl *pObj)

{
  FenceVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::FenceVkImpl> *this_local;
  
  this->m_pObject = pObj;
  if (this->m_pObject != (FenceVkImpl *)0x0) {
    RefCountedObject<Diligent::IFenceVk>::AddRef
              ((RefCountedObject<Diligent::IFenceVk> *)this->m_pObject);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }